

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

bool __thiscall
setup::anon_unknown_0::evaluator::eval_expression(evaluator *this,bool lazy,bool inner)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = eval_term(this,lazy);
  if (!bVar1 || inner) {
    do {
      if (this->token != identifier) {
        if (this->token != op_or) {
          return bVar1;
        }
        next(this);
      }
      bVar2 = eval_term(this,(bool)(bVar1 | lazy));
      bVar1 = (bool)(bVar1 | bVar2);
    } while (((~bVar1 | inner) & 1U) != 0);
  }
  return true;
}

Assistant:

bool eval_expression(bool lazy, bool inner = true) {
		bool result = eval_term(lazy);
		if(result && !inner) {
			return result;
		}
		while(token == op_or || token == identifier) {
			if(token == op_or) {
				next();
			}
			result = eval_term(lazy || result) || result;
			if(result && !inner) {
				return result;
			}
		}
		return result;
	}